

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscreteFactoredStates.cpp
# Opt level: O0

string * __thiscall
MultiAgentDecisionProcessDiscreteFactoredStates::SoftPrint_abi_cxx11_
          (MultiAgentDecisionProcessDiscreteFactoredStates *this)

{
  ostream *poVar1;
  long in_RSI;
  string *in_RDI;
  TwoStageDynamicBayesianNetwork *in_stack_00000008;
  stringstream ss;
  MADPComponentDiscreteActions *in_stack_00000118;
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [48];
  string local_1b8 [32];
  stringstream local_198 [16];
  ostream local_188 [256];
  MADPComponentDiscreteObservations *in_stack_ffffffffffffff78;
  MultiAgentDecisionProcess *in_stack_ffffffffffffff98;
  
  std::__cxx11::stringstream::stringstream(local_198);
  MultiAgentDecisionProcess::SoftPrint_abi_cxx11_(in_stack_ffffffffffffff98);
  std::operator<<(local_188,local_1b8);
  std::__cxx11::string::~string(local_1b8);
  MADPComponentFactoredStates::SoftPrint_abi_cxx11_
            ((MADPComponentFactoredStates *)in_stack_ffffffffffffff98);
  std::operator<<(local_188,local_1e8);
  std::__cxx11::string::~string(local_1e8);
  MADPComponentDiscreteActions::SoftPrint_abi_cxx11_(in_stack_00000118);
  std::operator<<(local_188,local_208);
  std::__cxx11::string::~string(local_208);
  MADPComponentDiscreteObservations::SoftPrint_abi_cxx11_(in_stack_ffffffffffffff78);
  std::operator<<(local_188,local_228);
  std::__cxx11::string::~string(local_228);
  TwoStageDynamicBayesianNetwork::SoftPrint_abi_cxx11_(in_stack_00000008);
  std::operator<<(local_188,local_248);
  std::__cxx11::string::~string(local_248);
  if ((*(byte *)(in_RSI + 0x228) & 1) != 0) {
    poVar1 = std::operator<<(local_188,"Transition model: ");
    poVar1 = std::operator<<(poVar1,"(not yet implemented)");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<(local_188,"Observation model: ");
    poVar1 = std::operator<<(poVar1,"(not yet implemented)");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

string MultiAgentDecisionProcessDiscreteFactoredStates::SoftPrint() const
{
    stringstream ss;

    ss << MultiAgentDecisionProcess::SoftPrint();
    ss << _m_S.SoftPrint();
    ss << _m_A.SoftPrint();
    ss << _m_O.SoftPrint();   
    ss << _m_2dbn.SoftPrint();
    if(_m_initialized)
    {
        ss << "Transition model: " << 
            "(not yet implemented)"
            << endl;
        //ss << _m_p_tModel->SoftPrint();
        ss << "Observation model: " << 
            "(not yet implemented)"
            << endl;
        //ss << _m_p_oModel->SoftPrint();
    }
    return(ss.str());
}